

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O1

bool __thiscall glslang::HlslGrammar::acceptPreQualifier(HlslGrammar *this,TQualifier *qualifier)

{
  bool bVar1;
  EHlslTokenClass EVar2;
  ulong uVar3;
  uint uVar4;
  HlslParseContext *this_00;
  TLayoutGeometry local_2c;
  
LAB_0042c65a:
  do {
    EVar2 = HlslTokenStream::peek(&this->super_HlslTokenStream);
    bVar1 = true;
    switch(EVar2) {
    case EHTokStatic:
      uVar3 = (*(ulong *)&qualifier->field_0x8 & 0xffffffffffffff80) + 1;
      goto LAB_0042c817;
    case EHTokConst:
      uVar3 = *(ulong *)&qualifier->field_0x8 & 0xffffffffffffff80 | 2;
      goto LAB_0042c817;
    default:
      goto switchD_0042c679_caseD_3;
    case EHTokExtern:
    case EHTokShared:
    case EHTokInline:
      break;
    case EHTokUniform:
      uVar3 = *(ulong *)&qualifier->field_0x8 & 0xffffffffffffff80 | 5;
      goto LAB_0042c817;
    case EHTokVolatile:
      qualifier->field_0xe = qualifier->field_0xe | 4;
      break;
    case EHTokPrecise:
      qualifier->field_0xc = qualifier->field_0xc | 0x10;
      break;
    case EHTokGroupShared:
      uVar3 = *(ulong *)&qualifier->field_0x8 & 0xffffffffffffff80 | 7;
      goto LAB_0042c817;
    case EHTokLinear:
      qualifier->field_0xb = qualifier->field_0xb | 0x40;
      break;
    case EHTokCentroid:
      qualifier->field_0xb = qualifier->field_0xb | 0x20;
      break;
    case EHTokNointerpolation:
      qualifier->field_0xb = qualifier->field_0xb | 0x80;
      break;
    case EHTokNoperspective:
      qualifier->field_0xc = qualifier->field_0xc | 0x20;
      break;
    case EHTokSample:
      qualifier->field_0xd = qualifier->field_0xd | 0x20;
      break;
    case EHTokRowMajor:
      uVar3 = *(ulong *)&qualifier->field_0x8 & 0x1fffffffffffffff | 0x4000000000000000;
      goto LAB_0042c817;
    case EHTokColumnMajor:
      uVar3 = (*(ulong *)&qualifier->field_0x8 & 0x1fffffffffffffff) + 0x2000000000000000;
      goto LAB_0042c817;
    case EHTokIn:
      uVar4 = (uint)*(ulong *)&qualifier->field_0x8 & 0x7f;
      if (uVar4 != 5) {
        uVar3 = (*(ulong *)&qualifier->field_0x8 & 0xffffffffffffff80) + (ulong)(uVar4 == 0x11) * 2
                + 0x10;
        goto LAB_0042c817;
      }
      break;
    case EHTokOut:
      uVar3 = (*(ulong *)&qualifier->field_0x8 & 0xffffffffffffff80) +
              (ulong)(((uint)*(ulong *)&qualifier->field_0x8 & 0x7f) == 0x10) + 0x11;
      goto LAB_0042c817;
    case EHTokInOut:
      uVar3 = *(ulong *)&qualifier->field_0x8 & 0xffffffffffffff80 | 0x12;
LAB_0042c817:
      *(ulong *)&qualifier->field_0x8 = uVar3;
      break;
    case EHTokLayout:
      goto switchD_0042c679_caseD_16;
    case EHTokGloballyCoherent:
      qualifier->field_0xe = qualifier->field_0xe | 2;
      break;
    case EHTokPoint:
      *(ulong *)&qualifier->field_0x8 = *(ulong *)&qualifier->field_0x8 & 0xffffffffffffff80 | 0x10;
      this_00 = this->parseContext;
      local_2c = ElgPoints;
      goto LAB_0042c84b;
    case EHTokLine:
      *(ulong *)&qualifier->field_0x8 = *(ulong *)&qualifier->field_0x8 & 0xffffffffffffff80 | 0x10;
      this_00 = this->parseContext;
      local_2c = ElgLines;
      goto LAB_0042c84b;
    case EHTokTriangle:
      *(ulong *)&qualifier->field_0x8 = *(ulong *)&qualifier->field_0x8 & 0xffffffffffffff80 | 0x10;
      this_00 = this->parseContext;
      local_2c = ElgTriangles;
      goto LAB_0042c84b;
    case EHTokLineAdj:
      *(ulong *)&qualifier->field_0x8 = *(ulong *)&qualifier->field_0x8 & 0xffffffffffffff80 | 0x10;
      this_00 = this->parseContext;
      local_2c = ElgLinesAdjacency;
      goto LAB_0042c84b;
    case EHTokTriangleAdj:
      *(ulong *)&qualifier->field_0x8 = *(ulong *)&qualifier->field_0x8 & 0xffffffffffffff80 | 0x10;
      this_00 = this->parseContext;
      local_2c = ElgTrianglesAdjacency;
LAB_0042c84b:
      bVar1 = HlslParseContext::handleInputGeometry
                        (this_00,&(this->super_HlslTokenStream).token.loc,&local_2c);
      if (!bVar1) goto LAB_0042c864;
    }
    HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
  } while( true );
switchD_0042c679_caseD_16:
  bVar1 = acceptLayoutQualifierList(this,qualifier);
  if (!bVar1) {
LAB_0042c864:
    bVar1 = false;
switchD_0042c679_caseD_3:
    return bVar1;
  }
  goto LAB_0042c65a;
}

Assistant:

bool HlslGrammar::acceptPreQualifier(TQualifier& qualifier)
{
    do {
        switch (peek()) {
        case EHTokStatic:
            qualifier.storage = EvqGlobal;
            break;
        case EHTokExtern:
            // TODO: no meaning in glslang?
            break;
        case EHTokShared:
            // TODO: hint
            break;
        case EHTokGroupShared:
            qualifier.storage = EvqShared;
            break;
        case EHTokUniform:
            qualifier.storage = EvqUniform;
            break;
        case EHTokConst:
            qualifier.storage = EvqConst;
            break;
        case EHTokVolatile:
            qualifier.volatil = true;
            break;
        case EHTokLinear:
            qualifier.smooth = true;
            break;
        case EHTokCentroid:
            qualifier.centroid = true;
            break;
        case EHTokNointerpolation:
            qualifier.flat = true;
            break;
        case EHTokNoperspective:
            qualifier.nopersp = true;
            break;
        case EHTokSample:
            qualifier.sample = true;
            break;
        case EHTokRowMajor:
            qualifier.layoutMatrix = ElmColumnMajor;
            break;
        case EHTokColumnMajor:
            qualifier.layoutMatrix = ElmRowMajor;
            break;
        case EHTokPrecise:
            qualifier.noContraction = true;
            break;
        case EHTokIn:
            if (qualifier.storage != EvqUniform) {
                qualifier.storage = (qualifier.storage == EvqOut) ? EvqInOut : EvqIn;
            }
            break;
        case EHTokOut:
            qualifier.storage = (qualifier.storage == EvqIn) ? EvqInOut : EvqOut;
            break;
        case EHTokInOut:
            qualifier.storage = EvqInOut;
            break;
        case EHTokLayout:
            if (! acceptLayoutQualifierList(qualifier))
                return false;
            continue;
        case EHTokGloballyCoherent:
            qualifier.coherent = true;
            break;
        case EHTokInline:
            // TODO: map this to SPIR-V function control
            break;

        // GS geometries: these are specified on stage input variables, and are an error (not verified here)
        // for output variables.
        case EHTokPoint:
            qualifier.storage = EvqIn;
            if (!parseContext.handleInputGeometry(token.loc, ElgPoints))
                return false;
            break;
        case EHTokLine:
            qualifier.storage = EvqIn;
            if (!parseContext.handleInputGeometry(token.loc, ElgLines))
                return false;
            break;
        case EHTokTriangle:
            qualifier.storage = EvqIn;
            if (!parseContext.handleInputGeometry(token.loc, ElgTriangles))
                return false;
            break;
        case EHTokLineAdj:
            qualifier.storage = EvqIn;
            if (!parseContext.handleInputGeometry(token.loc, ElgLinesAdjacency))
                return false;
            break;
        case EHTokTriangleAdj:
            qualifier.storage = EvqIn;
            if (!parseContext.handleInputGeometry(token.loc, ElgTrianglesAdjacency))
                return false;
            break;

        default:
            return true;
        }
        advanceToken();
    } while (true);
}